

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitSIMDTernary
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          SIMDTernary *curr)

{
  Name breakTo;
  Name breakTo_00;
  Name breakTo_01;
  Name breakTo_02;
  Name breakTo_03;
  Name breakTo_04;
  Name breakTo_05;
  bool bVar1;
  ExpressionRunner<wasm::CExpressionRunner> *pEVar2;
  Literal *pLVar3;
  Literal local_2b0;
  size_t local_298;
  char *pcStack_290;
  Literal local_280;
  size_t local_268;
  char *pcStack_260;
  Literal local_250;
  size_t local_238;
  char *pcStack_230;
  Literal local_220;
  size_t local_208;
  char *pcStack_200;
  Literal local_1f0;
  size_t local_1d8;
  char *pcStack_1d0;
  Literal local_1c0;
  size_t local_1a8;
  char *pcStack_1a0;
  Literal local_190;
  size_t local_178;
  char *pcStack_170;
  Literal local_168;
  undefined1 local_150 [8];
  Literal c;
  undefined1 local_f0 [8];
  Literal b;
  undefined1 local_90 [8];
  Literal a;
  undefined1 local_68 [8];
  Flow flow;
  SIMDTernary *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::CExpressionRunner> *)self(this);
  visit((Flow *)local_68,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    a.type.id._0_4_ = 1;
  }
  else {
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::Literal((Literal *)local_90,pLVar3);
    pEVar2 = (ExpressionRunner<wasm::CExpressionRunner> *)self(this);
    visit((Flow *)&b.type,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x20));
    Flow::operator=((Flow *)local_68,(Flow *)&b.type);
    Flow::~Flow((Flow *)&b.type);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      a.type.id._0_4_ = 1;
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      wasm::Literal::Literal((Literal *)local_f0,pLVar3);
      pEVar2 = (ExpressionRunner<wasm::CExpressionRunner> *)self(this);
      visit((Flow *)&c.type,pEVar2,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x28));
      Flow::operator=((Flow *)local_68,(Flow *)&c.type);
      Flow::~Flow((Flow *)&c.type);
      bVar1 = Flow::breaking((Flow *)local_68);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
        a.type.id._0_4_ = 1;
      }
      else {
        pLVar3 = Flow::getSingleValue((Flow *)local_68);
        wasm::Literal::Literal((Literal *)local_150,pLVar3);
        switch(*(undefined4 *)(flow.breakTo.super_IString.str._M_str + 0x10)) {
        case 0:
        case 7:
        case 8:
        case 9:
        case 10:
          wasm::Literal::bitselectV128
                    (&local_168,(Literal *)local_150,(Literal *)local_90,(Literal *)local_f0);
          Flow::Flow(__return_storage_ptr__,&local_168);
          wasm::Literal::~Literal(&local_168);
          break;
        case 1:
          if (this->relaxedBehavior == NonConstant) {
            local_178 = NONCONSTANT_FLOW;
            pcStack_170 = DAT_03194068;
            breakTo_05.super_IString.str._M_str = DAT_03194068;
            breakTo_05.super_IString.str._M_len = NONCONSTANT_FLOW;
            Flow::Flow(__return_storage_ptr__,breakTo_05);
          }
          else {
            wasm::Literal::relaxedMaddF16x8
                      (&local_190,(Literal *)local_90,(Literal *)local_f0,(Literal *)local_150);
            Flow::Flow(__return_storage_ptr__,&local_190);
            wasm::Literal::~Literal(&local_190);
          }
          break;
        case 2:
          if (this->relaxedBehavior == NonConstant) {
            local_1a8 = NONCONSTANT_FLOW;
            pcStack_1a0 = DAT_03194068;
            breakTo_04.super_IString.str._M_str = DAT_03194068;
            breakTo_04.super_IString.str._M_len = NONCONSTANT_FLOW;
            Flow::Flow(__return_storage_ptr__,breakTo_04);
          }
          else {
            wasm::Literal::relaxedNmaddF16x8
                      (&local_1c0,(Literal *)local_90,(Literal *)local_f0,(Literal *)local_150);
            Flow::Flow(__return_storage_ptr__,&local_1c0);
            wasm::Literal::~Literal(&local_1c0);
          }
          break;
        case 3:
          if (this->relaxedBehavior == NonConstant) {
            local_1d8 = NONCONSTANT_FLOW;
            pcStack_1d0 = DAT_03194068;
            breakTo_03.super_IString.str._M_str = DAT_03194068;
            breakTo_03.super_IString.str._M_len = NONCONSTANT_FLOW;
            Flow::Flow(__return_storage_ptr__,breakTo_03);
          }
          else {
            wasm::Literal::relaxedMaddF32x4
                      (&local_1f0,(Literal *)local_90,(Literal *)local_f0,(Literal *)local_150);
            Flow::Flow(__return_storage_ptr__,&local_1f0);
            wasm::Literal::~Literal(&local_1f0);
          }
          break;
        case 4:
          if (this->relaxedBehavior == NonConstant) {
            local_208 = NONCONSTANT_FLOW;
            pcStack_200 = DAT_03194068;
            breakTo_02.super_IString.str._M_str = DAT_03194068;
            breakTo_02.super_IString.str._M_len = NONCONSTANT_FLOW;
            Flow::Flow(__return_storage_ptr__,breakTo_02);
          }
          else {
            wasm::Literal::relaxedNmaddF32x4
                      (&local_220,(Literal *)local_90,(Literal *)local_f0,(Literal *)local_150);
            Flow::Flow(__return_storage_ptr__,&local_220);
            wasm::Literal::~Literal(&local_220);
          }
          break;
        case 5:
          if (this->relaxedBehavior == NonConstant) {
            local_238 = NONCONSTANT_FLOW;
            pcStack_230 = DAT_03194068;
            breakTo_01.super_IString.str._M_str = DAT_03194068;
            breakTo_01.super_IString.str._M_len = NONCONSTANT_FLOW;
            Flow::Flow(__return_storage_ptr__,breakTo_01);
          }
          else {
            wasm::Literal::relaxedMaddF64x2
                      (&local_250,(Literal *)local_90,(Literal *)local_f0,(Literal *)local_150);
            Flow::Flow(__return_storage_ptr__,&local_250);
            wasm::Literal::~Literal(&local_250);
          }
          break;
        case 6:
          if (this->relaxedBehavior == NonConstant) {
            local_268 = NONCONSTANT_FLOW;
            pcStack_260 = DAT_03194068;
            breakTo_00.super_IString.str._M_str = DAT_03194068;
            breakTo_00.super_IString.str._M_len = NONCONSTANT_FLOW;
            Flow::Flow(__return_storage_ptr__,breakTo_00);
          }
          else {
            wasm::Literal::relaxedNmaddF64x2
                      (&local_280,(Literal *)local_90,(Literal *)local_f0,(Literal *)local_150);
            Flow::Flow(__return_storage_ptr__,&local_280);
            wasm::Literal::~Literal(&local_280);
          }
          break;
        case 0xb:
          if (this->relaxedBehavior == NonConstant) {
            local_298 = NONCONSTANT_FLOW;
            pcStack_290 = DAT_03194068;
            breakTo.super_IString.str._M_str = DAT_03194068;
            breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
            Flow::Flow(__return_storage_ptr__,breakTo);
          }
          else {
            wasm::Literal::dotSI8x16toI16x8Add
                      (&local_2b0,(Literal *)local_90,(Literal *)local_f0,(Literal *)local_150);
            Flow::Flow(__return_storage_ptr__,&local_2b0);
            wasm::Literal::~Literal(&local_2b0);
          }
          break;
        default:
          handle_unreachable("invalid op",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                             ,0x523);
        }
        a.type.id._0_4_ = 1;
        wasm::Literal::~Literal((Literal *)local_150);
      }
      wasm::Literal::~Literal((Literal *)local_f0);
    }
    wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDTernary(SIMDTernary* curr) {
    NOTE_ENTER("SIMDBitselect");
    Flow flow = self()->visit(curr->a);
    if (flow.breaking()) {
      return flow;
    }
    Literal a = flow.getSingleValue();
    flow = self()->visit(curr->b);
    if (flow.breaking()) {
      return flow;
    }
    Literal b = flow.getSingleValue();
    flow = self()->visit(curr->c);
    if (flow.breaking()) {
      return flow;
    }
    Literal c = flow.getSingleValue();
    switch (curr->op) {
      case Bitselect:
      case LaneselectI8x16:
      case LaneselectI16x8:
      case LaneselectI32x4:
      case LaneselectI64x2:
        return c.bitselectV128(a, b);

      case RelaxedMaddVecF16x8:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedMaddF16x8(b, c);
      case RelaxedNmaddVecF16x8:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedNmaddF16x8(b, c);
      case RelaxedMaddVecF32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedMaddF32x4(b, c);
      case RelaxedNmaddVecF32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedNmaddF32x4(b, c);
      case RelaxedMaddVecF64x2:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedMaddF64x2(b, c);
      case RelaxedNmaddVecF64x2:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedNmaddF64x2(b, c);
      case DotI8x16I7x16AddSToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.dotSI8x16toI16x8Add(b, c);
    }
    WASM_UNREACHABLE("invalid op");
  }